

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O3

void mempool_stats(mempool *pool,mempool_stats *stats)

{
  undefined1 uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t uVar5;
  ulong uVar6;
  
  uVar2 = pool->objsize;
  stats->objsize = uVar2;
  uVar3 = (pool->slabs).stats.used;
  stats->objcount = (uint32_t)(uVar3 / uVar2);
  if (pool->slab_order <= pool->cache->order_max) {
    uVar1 = pool->cache->order0_size_lb;
    uVar6 = 1L << (pool->slab_order + uVar1 & 0x3f);
    stats->slabsize = (uint32_t)uVar6;
    uVar4 = (pool->slabs).stats.total;
    uVar5 = (uint32_t)(uVar4 / (uVar6 & 0xffffffff));
    stats->slabcount = uVar5;
    (stats->totals).used = uVar3;
    (stats->totals).total = uVar4 - uVar5 * 0x70;
    return;
  }
  __assert_fail("order <= cache->order_max",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                ,0xee,"intptr_t slab_order_size(struct slab_cache *, uint8_t)");
}

Assistant:

void
mempool_stats(struct mempool *pool, struct mempool_stats *stats)
{
	/* Object size. */
	stats->objsize = pool->objsize;
	/* Number of objects. */
	stats->objcount = mempool_count(pool);
	/* Size of the slab. */
	stats->slabsize = slab_order_size(pool->cache, pool->slab_order);
	/* The number of slabs. */
	stats->slabcount = pool->slabs.stats.total/stats->slabsize;
	/* How much memory is used for slabs. */
	stats->totals.used = pool->slabs.stats.used;
	/*
	 * How much memory is available. Subtract the slab size,
	 * which is allocation overhead and is not available
	 * memory.
	 */
	stats->totals.total = pool->slabs.stats.total -
		mslab_sizeof() * stats->slabcount;
}